

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySimple.c
# Opt level: O2

permInfo * setPermInfoPtr(int var)

{
  uint uVar1;
  permInfo *pi;
  int *piVar2;
  int iVar3;
  
  pi = (permInfo *)malloc(0x28);
  pi->flipCtr = 0;
  pi->varN = var;
  uVar1 = ~(-1 << ((byte)var & 0x1f));
  pi->totalFlips = uVar1;
  pi->swapCtr = 0;
  iVar3 = 1;
  for (; 1 < (uint)var; var = var - 1) {
    iVar3 = iVar3 * var;
  }
  pi->totalSwaps = iVar3 + -1;
  piVar2 = (int *)malloc((ulong)uVar1 << 2);
  pi->flipArray = piVar2;
  piVar2 = (int *)malloc((long)iVar3 * 4 - 4);
  pi->swapArray = piVar2;
  fillInSwapArray(pi);
  fillInFlipArray(pi);
  return pi;
}

Assistant:

permInfo* setPermInfoPtr(int var)
{
	permInfo* x;
	x = (permInfo*) malloc(sizeof(permInfo));
	x->flipCtr=0;
	x->varN = var; 
	x->totalFlips=(1<<var)-1;
	x->swapCtr=0;
	x->totalSwaps=factorial(var)-1;
	x->flipArray = (int*) malloc(sizeof(int)*x->totalFlips);
	x->swapArray = (int*) malloc(sizeof(int)*x->totalSwaps);
	fillInSwapArray(x);
	fillInFlipArray(x);
	return x;
}